

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&> *
__thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *__return_storage_ptr__,PolymorphicMatcher *this)

{
  MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *pMVar1;
  
  pMVar1 = (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)operator_new(0x28);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MonomorphicImpl_0013c2b8;
  pMVar1[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)(pMVar1 + 3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pMVar1 + 1),*(long *)this,*(long *)(this + 8) + *(long *)this);
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).impl_.value_ = pMVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).impl_.link_.next_ =
       &(__return_storage_ptr__->
        super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ).impl_.link_;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0013c330;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<T>(impl_));
  }